

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::CreateObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phObject,int op)

{
  SessionObjectStore *this_00;
  HandleManager *this_01;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  CK_BBOOL CVar4;
  CK_BBOOL CVar5;
  P11Object *this_02;
  CK_OBJECT_CLASS CVar6;
  int iVar7;
  Session *this_03;
  CK_RV CVar8;
  CK_STATE sessionState;
  SessionObject *object;
  CK_SLOT_ID CVar9;
  CK_OBJECT_HANDLE CVar10;
  byte bVar11;
  CK_ULONG ulAttributeCount;
  long lVar12;
  int loglevel;
  CK_ATTRIBUTE *pCVar13;
  char *format;
  bool bVar14;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_OBJECT_CLASS local_900;
  Token *local_8f8;
  Slot *local_8f0;
  CK_SESSION_HANDLE local_8e8;
  P11Object *p11object;
  CK_OBJECT_HANDLE *local_8d8;
  CK_CERTIFICATE_TYPE certType;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_8b8;
  OSAttribute local_818;
  OSAttribute local_778;
  OSAttribute local_6d8;
  CK_ATTRIBUTE attribs [32];
  CK_ATTRIBUTE saveAttribs [32];
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (phObject == (CK_OBJECT_HANDLE_PTR)0x0 || pTemplate == (CK_ATTRIBUTE_PTR)0x0) {
    return 7;
  }
  local_8e8 = hSession;
  local_8d8 = phObject;
  this_03 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_03 == (Session *)0x0) {
    return 0xb3;
  }
  local_8f0 = Session::getSlot(this_03);
  if (local_8f0 == (Slot *)0x0) {
    return 5;
  }
  local_8f8 = Session::getToken(this_03);
  if (local_8f8 == (Token *)0x0) {
    return 5;
  }
  objClass = 0;
  keyType = 0;
  certType = 0;
  isOnToken = '\0';
  isPrivate = '\x01';
  CVar8 = extractObjectInformation
                    (pTemplate,ulCount,&objClass,&keyType,&certType,&isOnToken,&isPrivate,false);
  if (CVar8 != 0) {
    format = "Mandatory attribute not present in template";
    loglevel = 3;
    iVar7 = 0x2e96;
LAB_0012e301:
    softHSMLog(loglevel,"CreateObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar7,format);
    return CVar8;
  }
  sessionState = Session::getState(this_03);
  CVar5 = isOnToken;
  CVar4 = isPrivate;
  CVar8 = haveWrite(sessionState,isOnToken,isPrivate);
  if (CVar8 != 0) {
    if (CVar8 == 0xb5) {
      format = "Session is read-only";
      loglevel = 6;
      iVar7 = 0x2ea1;
    }
    else {
      if (CVar8 != 0x101) {
        return CVar8;
      }
      format = "User is not authorized";
      loglevel = 6;
      iVar7 = 0x2e9f;
    }
    goto LAB_0012e301;
  }
  if (0x20 < ulCount) {
    return 0xd1;
  }
  if (ulCount == 0) {
    ulAttributeCount = 0;
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    ulAttributeCount = 0;
    do {
      bVar14 = pTemplate->type == 0x90;
      pCVar13 = attribs + ulAttributeCount;
      if (bVar14) {
        pCVar13 = saveAttribs + lVar12;
      }
      ulAttributeCount = !bVar14 + ulAttributeCount;
      lVar12 = (ulong)bVar14 + lVar12;
      pCVar13->ulValueLen = pTemplate->ulValueLen;
      pvVar1 = pTemplate->pValue;
      pCVar13->type = pTemplate->type;
      pCVar13->pValue = pvVar1;
      pTemplate = pTemplate + 1;
      ulCount = ulCount - 1;
    } while (ulCount != 0);
  }
  if (lVar12 != 0) {
    memcpy(attribs + ulAttributeCount,saveAttribs,lVar12 * 0x18);
    ulAttributeCount = ulAttributeCount + lVar12;
  }
  CVar6 = objClass;
  p11object = (P11Object *)0x0;
  CVar8 = newP11Object(objClass,keyType,certType,&p11object);
  if (CVar8 != 0) {
    return CVar8;
  }
  local_900 = CVar6;
  if (CVar5 == '\0') {
    this_00 = this->sessionObjectStore;
    CVar9 = Slot::getSlotID(local_8f0);
    object = SessionObjectStore::createObject(this_00,CVar9,local_8e8,CVar4 != '\0');
  }
  else {
    object = (SessionObject *)Token::createObject(local_8f8);
  }
  this_02 = p11object;
  if ((object == (SessionObject *)0x0) ||
     (iVar7 = (*p11object->_vptr_P11Object[2])(p11object,object), (char)iVar7 == '\0')) {
    if (p11object == (P11Object *)0x0) {
      return 5;
    }
    (*p11object->_vptr_P11Object[1])();
    return 5;
  }
  CVar8 = P11Object::saveTemplate(this_02,local_8f8,CVar4 != '\0',attribs,ulAttributeCount,op);
  (*this_02->_vptr_P11Object[1])(this_02);
  if (CVar8 != 0) {
    return CVar8;
  }
  if (op != 2) goto LAB_0012e6ef;
  if (local_900 == 2) {
    iVar7 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object);
    if ((char)iVar7 == '\0') {
      bVar11 = 1;
      bVar14 = false;
    }
    else {
      OSAttribute::OSAttribute(&local_6d8,false);
      iVar7 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x163,&local_6d8);
      bVar14 = true;
      if ((char)iVar7 == '\0') {
        bVar11 = 1;
      }
      else {
        iVar7 = (*(object->super_OSObject)._vptr_OSObject[0xc])(object);
        bVar11 = (byte)iVar7 ^ 1;
      }
    }
  }
  else {
    bVar14 = false;
    bVar11 = 0;
  }
  if (bVar14) {
    OSAttribute::~OSAttribute(&local_6d8);
  }
  if (bVar11 != 0) {
    return 5;
  }
  if (local_900 - 3 < 2) {
    iVar7 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object);
    if ((char)iVar7 == '\0') {
      bVar11 = 1;
      bVar3 = false;
      bVar2 = false;
      bVar14 = false;
    }
    else {
      OSAttribute::OSAttribute(&local_778,false);
      iVar7 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x163,&local_778);
      if ((char)iVar7 == '\0') {
        bVar2 = false;
        bVar14 = false;
      }
      else {
        OSAttribute::OSAttribute(&local_818,false);
        iVar7 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x165,&local_818);
        if ((char)iVar7 == '\0') {
          bVar14 = false;
          bVar2 = true;
        }
        else {
          OSAttribute::OSAttribute(&local_8b8,false);
          iVar7 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x164,&local_8b8);
          bVar3 = true;
          if ((char)iVar7 != '\0') {
            iVar7 = (*(object->super_OSObject)._vptr_OSObject[0xc])(object);
            bVar11 = (byte)iVar7 ^ 1;
            bVar2 = true;
            bVar14 = true;
            goto LAB_0012e6b2;
          }
          bVar2 = true;
          bVar14 = true;
        }
      }
      bVar3 = true;
      bVar11 = 1;
    }
  }
  else {
    bVar3 = false;
    bVar2 = false;
    bVar14 = false;
    bVar11 = 0;
  }
LAB_0012e6b2:
  if (bVar14) {
    OSAttribute::~OSAttribute(&local_8b8);
  }
  if (bVar2) {
    OSAttribute::~OSAttribute(&local_818);
  }
  if (bVar3) {
    OSAttribute::~OSAttribute(&local_778);
  }
  if (bVar11 != 0) {
    return 5;
  }
LAB_0012e6ef:
  this_01 = this->handleManager;
  CVar9 = Slot::getSlotID(local_8f0);
  if (CVar5 == '\0') {
    CVar10 = HandleManager::addSessionObject(this_01,CVar9,local_8e8,CVar4 != '\0',object);
  }
  else {
    CVar10 = HandleManager::addTokenObject(this_01,CVar9,CVar4 != '\0',object);
  }
  *local_8d8 = CVar10;
  return 0;
}

Assistant:

CK_RV SoftHSM::CreateObject(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phObject, int op)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phObject == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass = CKO_DATA;
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	bool isImplicit = false;
	CK_RV rv = extractObjectInformation(pTemplate,ulCount,objClass,keyType,certType, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Check user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Change order of attributes
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE attribs[maxAttribs];
	CK_ATTRIBUTE saveAttribs[maxAttribs];
	CK_ULONG attribsCount = 0;
	CK_ULONG saveAttribsCount = 0;
	if (ulCount > maxAttribs)
	{
		return CKR_TEMPLATE_INCONSISTENT;
	}
	for (CK_ULONG i=0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				saveAttribs[saveAttribsCount++] = pTemplate[i];
				break;
			default:
				attribs[attribsCount++] = pTemplate[i];
		}
	}
	for (CK_ULONG i=0; i < saveAttribsCount; i++)
	{
		attribs[attribsCount++] = saveAttribs[i];
	}

	P11Object* p11object = NULL;
	rv = newP11Object(objClass,keyType,certType,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Create the object in session or on the token
	OSObject *object = NULL_PTR;
	if (isOnToken)
	{
		object = (OSObject*) token->createObject();
	}
	else
	{
		object = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}

	if (object == NULL || !p11object->init(object))
	{
		delete p11object;
		return CKR_GENERAL_ERROR;
	}

	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, attribs,attribsCount,op);
	delete p11object;
	if (rv != CKR_OK)
		return rv;

	if (op == OBJECT_OP_CREATE)
	{
		if (objClass == CKO_PUBLIC_KEY &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}

		if ((objClass == CKO_SECRET_KEY || objClass == CKO_PRIVATE_KEY) &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->setAttribute(CKA_ALWAYS_SENSITIVE, false) ||
		    !object->setAttribute(CKA_NEVER_EXTRACTABLE, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}
	}

	if (isOnToken)
	{
		*phObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, object);
	} else {
		*phObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, object);
	}

	return CKR_OK;
}